

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O3

void find_suite::find(void)

{
  basic_iterator<int> first_end;
  ulong uVar1;
  ulong uVar2;
  initializer_list<int> input;
  initializer_list<int> __l;
  basic_iterator<int> first_begin;
  vector<int,_std::allocator<int>_> expect;
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  allocator_type local_79;
  vector<int,_std::allocator<int>_> local_78;
  view_pointer local_60;
  size_type sStack_58;
  int local_50 [2];
  type local_48 [4];
  circular_view<int,_18446744073709551615UL> local_38;
  
  local_38.member.data = local_48;
  local_48[0] = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = 0;
  local_38.member.cap = 4;
  local_38.member.size = 0;
  local_38.member.next = 4;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x2c00000021;
  input._M_len = 4;
  input._M_array = (iterator)&local_78;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_38,input);
  uVar1 = local_38.member.cap * 2;
  if ((uVar1 & local_38.member.cap * 2 - 1) == 0) {
    uVar2 = local_38.member.next - local_38.member.size & uVar1 - 1;
    uVar1 = uVar1 - 1 & local_38.member.next;
  }
  else {
    uVar2 = (local_38.member.next - local_38.member.size) % uVar1;
    uVar1 = local_38.member.next % uVar1;
  }
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0x21);
  first_begin = std::
                __find_if<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                          (&local_38,uVar2,&local_38,uVar1);
  local_50[0] = 0x21;
  local_50[1] = 0x2c;
  __l._M_len = 2;
  __l._M_array = local_50;
  std::vector<int,_std::allocator<int>_>::vector(&local_78,__l,&local_79);
  uVar1 = local_38.member.cap * 2;
  if ((uVar1 & local_38.member.cap * 2 - 1) == 0) {
    sStack_58 = uVar1 - 1 & local_38.member.next;
  }
  else {
    sStack_58 = local_38.member.next % uVar1;
  }
  first_end.current = sStack_58;
  first_end.parent = &local_38;
  local_60 = &local_38;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0x131,"void find_suite::find()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void find()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44 };
    auto where = std::find(span.begin(), span.end(), 33);
    {
        std::vector<int> expect = { 33, 44 };
        BOOST_TEST_ALL_EQ(where, span.end(),
                          expect.begin(), expect.end());
    }
}